

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void zhugeliang(dw_rom *rom)

{
  byte bVar1;
  ulong uVar2;
  uint16_t address;
  ulong uVar3;
  bool bVar4;
  
  doae(rom);
  vpatch(rom,0x1a8e,3,0x29,0x37,0x14);
  uVar2 = 0x13b5;
  do {
    uVar3 = uVar2;
    do {
      bVar1 = rom->content[uVar3];
      if ((bVar1 & 3) == 0) {
        rom->content[uVar3] = bVar1 | 1;
      }
      uVar3 = uVar3 + 2;
    } while (uVar3 <= uVar2 + 0x4e);
    bVar4 = uVar2 < 0x15b6;
    uVar2 = uVar2 + 0x100;
  } while (bVar4);
  vpatch(rom,0x12260,0x40,0xe0,0xe0,0xe0,0xe0,0xe0,0xc0,0x60,0x40,0,0x40,0x40,0x40,0,0xe0,0xe0,0xe0,
         0,0,0x80,0xe0,0xe0,0xe0,0xe0,0,0xe0,0xe0,0xc0,0x60,0,0xc0,0xe0,0xc0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0xc0,0x60,0x40,0,0x40,0x40,0x40,0,0xe0,0xe0,0xe0,0,0,0x80,0x60,0x60,0xe0,0xc0,0,0xe0,
         0xe0,0xc0,0xe0,0x80,0xe0,0xf0,0x60);
  vpatch(rom,0x12300,0x80,7,7,7,7,7,6,3,10,1,5,5,5,0,7,7,0xf,0x18,0x3c,0x3e,0x1f,0x3f,0xf,0xf,1,0x1f
         ,0x3f,0x3f,0x3f,0x39,0xe,0xf,0xf,7,7,7,7,7,6,3,0x1a,1,5,5,5,0,7,7,0x1f,8,0xc,0x3e,0x3f,0x3f
         ,0x1f,3,1,0x3f,0x3f,0x3f,0x3f,0x3b,0x1c,5,1,0xf0);
  vpatch(rom,0x12400,0x180,7,7,7,7,7,6,3,10,1,5,5,5,0,7,7,0xf,0x18,0x3c,0x3e,0x1f,0x3f,0xf,0xf,1,
         0x1f,0x3f,0x3f,0x3f,0x39,0xe,0xf,0xf,0xf0,0xf0,0xf0,0xf0,0xf0,0x30,0x60,0x2c,0x40,0x50,0x50
         ,0x50,0,0xf0,0xf0,0xfc,8,0x98,0x3e,0xfe,0xfe,0xfc,0xe0,0xc0,0xfe,0xfe,0xfe,0xfe,0xee,0x1c,
         0x50,0xc0,7);
  vpatch(rom,0x12a20,0x70,0x1f,0x3f,0x3f,0x3f,0xf,7,7,1,0x1f,0x3f,0x3f,0x7c,0x7b,0x3f,7,7,0xff,0xff,
         0xfe,0xfc,0xf8,0xf0,0x80,0x80,0xff,0xff,0xfe,0x1c,0xe8,0xf0,0xf0,0x80,7,7,7,7,7,7,7,0xf,1,5
         ,5,5,0,7,7,8,0xf0,0xf6,0xff,0xf3,0xf3,0xf1,0xff,0xff,0x40,0x56,0x5f,0x5f,0xf,0xff,0xf1,0xd,
         0x3f);
  vpatch(rom,0x12aa0,0x10,0x70,0x78,0xfc,0xff,0xff,0xff,0x7e,0,0x1f,0x6f,0xf6,0xfb,0xf0,0xfe,0xff,
         0xc3);
  vpatch(rom,0x12ac0,0x10,0xf0,0xf6,0xff,0xf3,0xf3,0xf9,0xff,0xff,0x40,0x56,0x5f,0x5f,0xf,0xf7,0xf1,
         9);
  vpatch(rom,0x12ae0,0x10,0x70,0x78,0xfe,0xfe,0xfe,0x7f,0x7f,0,0x1f,0x6f,0xf6,0xfb,0xf1,0x7e,0x7f,
         0x3e);
  vpatch(rom,0x12b50,0x10,0xfe,0xfe,0xfe,0xfe,0xfe,0xc6,0x6c,0x44,0x28,0xaa,0xaa,0xaa,0,0xfe,0xfe,
         0xfe);
  vpatch(rom,0x12b80,0x20,0xfe,0xfe,0xfe,0xfe,0xfe,0xc6,0x6c,0x45,0x28,0xaa,0xaa,0xaa,0,0xfe,0xfe,
         0xff,0x3f,0x7f,0x7f,0x3f,0x3f,0x76,99,0x62,0,0x2a,10,0x2a,0,0x7f,0x7f,0x7f);
  vpatch(rom,0x12bd0,0x10,0x3f,0x7f,0x7f,0x3f,0x3f,0x76,99,0x62,0,0x2a,10,0x2a,0,0x7f,0x7f,0x7f);
  return;
}

Assistant:

static void zhugeliang(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8e,   3, 0x29, 0x37, 0x14);
    set_player_palette(rom, 1);
    vpatch(rom, 0x12260,  64, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xC0, 0x60, 0x40, 0x00, 0x40, 0x40, 0x40, 0x00, 0xE0, 0xE0, 0xE0, 0x00, 0x00, 0x80, 0xE0, 0xE0, 0xE0, 0xE0, 0x00, 0xE0, 0xE0, 0xC0, 0x60, 0x00, 0xC0, 0xE0, 0xC0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xC0, 0x60, 0x40, 0x00, 0x40, 0x40, 0x40, 0x00, 0xE0, 0xE0, 0xE0, 0x00, 0x00, 0x80, 0x60, 0x60, 0xE0, 0xC0, 0x00, 0xE0, 0xE0, 0xC0, 0xE0, 0x80, 0xE0, 0xF0, 0x60);
    vpatch(rom, 0x12300, 128, 0x07, 0x07, 0x07, 0x07, 0x07, 0x06, 0x03, 0x0A, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x0F, 0x18, 0x3C, 0x3E, 0x1F, 0x3F, 0x0F, 0x0F, 0x01, 0x1F, 0x3F, 0x3F, 0x3F, 0x39, 0x0E, 0x0F, 0x0F, 0x07, 0x07, 0x07, 0x07, 0x07, 0x06, 0x03, 0x1A, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x1F, 0x08, 0x0C, 0x3E, 0x3F, 0x3F, 0x1F, 0x03, 0x01, 0x3F, 0x3F, 0x3F, 0x3F, 0x3B, 0x1C, 0x05, 0x01, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xFC, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0x0C, 0xFE, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0x80, 0x80, 0xFE, 0xFE, 0xFE, 0x1C, 0xE8, 0xF0, 0xF0, 0x80, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF8, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0x08, 0xFC, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0xC0, 0xFC, 0xFE, 0xFE, 0x1E, 0xE8, 0xF0, 0xF0, 0xF0);
    vpatch(rom, 0x12400, 384, 0x07, 0x07, 0x07, 0x07, 0x07, 0x06, 0x03, 0x0A, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x0F, 0x18, 0x3C, 0x3E, 0x1F, 0x3F, 0x0F, 0x0F, 0x01, 0x1F, 0x3F, 0x3F, 0x3F, 0x39, 0x0E, 0x0F, 0x0F, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x30, 0x60, 0x2C, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0xFC, 0x08, 0x98, 0x3E, 0xFE, 0xFE, 0xFC, 0xE0, 0xC0, 0xFE, 0xFE, 0xFE, 0xFE, 0xEE, 0x1C, 0x50, 0xC0, 0x07, 0x07, 0x07, 0x07, 0x07, 0x06, 0x03, 0x1A, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x1F, 0x08, 0x0C, 0x3E, 0x3F, 0x3F, 0x1F, 0x03, 0x01, 0x3F, 0x3F, 0x3F, 0x3F, 0x3B, 0x1C, 0x05, 0x01, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x30, 0x60, 0x28, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0xF8, 0x0C, 0x9E, 0x3E, 0xFC, 0xFE, 0xF8, 0xF8, 0xC0, 0xFC, 0xFE, 0xFE, 0xFE, 0xCE, 0x38, 0x78, 0xF8, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x0F, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x08, 0x1F, 0x3F, 0x3F, 0x1F, 0x0F, 0x07, 0x07, 0x01, 0x1F, 0x3F, 0x3F, 0x3C, 0x0B, 0x07, 0x07, 0x07, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xFC, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0x0C, 0xFE, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0x80, 0x80, 0xFE, 0xFE, 0xFE, 0x1C, 0xE8, 0xF0, 0xF0, 0x80, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x1F, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x18, 0x3F, 0x3F, 0x3F, 0x1F, 0x0F, 0x07, 0x00, 0x00, 0x3F, 0x3F, 0x3F, 0x1C, 0x0B, 0x07, 0x07, 0x00, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF8, 0x40, 0x50, 0x50, 0x50, 0x00, 0xF0, 0xF0, 0x08, 0xFC, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0xC0, 0xFC, 0xFE, 0xFE, 0x1E, 0xE8, 0xF0, 0xF0, 0xF0, 0x07, 0x0F, 0x0F, 0x07, 0x07, 0x0E, 0x0C, 0x0C, 0x00, 0x05, 0x01, 0x05, 0x00, 0x0F, 0x0F, 0x0F, 0x0E, 0x0F, 0x1F, 0x1F, 0x13, 0x03, 0x0F, 0x00, 0x03, 0x0D, 0x1E, 0x1F, 0x1E, 0x0F, 0x0F, 0x07, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xC0, 0x60, 0x40, 0x00, 0x40, 0x40, 0x40, 0x00, 0xE0, 0xE0, 0xE0, 0x00, 0x00, 0x80, 0xE0, 0xE0, 0xE0, 0xE0, 0x00, 0xE0, 0xE0, 0xC0, 0x60, 0x00, 0xC0, 0xE0, 0xC0, 0x07, 0x0F, 0x0F, 0x07, 0x07, 0x0E, 0x0C, 0x0C, 0x00, 0x05, 0x01, 0x05, 0x00, 0x0F, 0x0F, 0x0F, 0x0E, 0x0F, 0x1F, 0x1E, 0x1E, 0x1F, 0x0F, 0x00, 0x03, 0x0D, 0x1E, 0x1F, 0x1D, 0x1F, 0x1F, 0x18, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xC0, 0x60, 0x40, 0x00, 0x40, 0x40, 0x40, 0x00, 0xE0, 0xE0, 0xE0, 0x00, 0x00, 0x80, 0x60, 0x60, 0xE0, 0xC0, 0x00, 0xE0, 0xE0, 0xC0, 0xE0, 0x80, 0xE0, 0xF0, 0x60);
    vpatch(rom, 0x12a20, 112, 0x1F, 0x3F, 0x3F, 0x3F, 0x0F, 0x07, 0x07, 0x01, 0x1F, 0x3F, 0x3F, 0x7C, 0x7B, 0x3F, 0x07, 0x07, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0x80, 0x80, 0xFF, 0xFF, 0xFE, 0x1C, 0xE8, 0xF0, 0xF0, 0x80, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x0F, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x08, 0xF0, 0xF6, 0xFF, 0xF3, 0xF3, 0xF1, 0xFF, 0xFF, 0x40, 0x56, 0x5F, 0x5F, 0x0F, 0xFF, 0xF1, 0x0D, 0x3F, 0x3F, 0x3F, 0x1F, 0x0F, 0x07, 0x00, 0x00, 0x3F, 0x3F, 0x7F, 0x7C, 0x3B, 0x07, 0x07, 0x00, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0xC0, 0xFF, 0xFF, 0xFE, 0x1C, 0xE8, 0xF0, 0xF0, 0xF0, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x1F, 0x01, 0x05, 0x05, 0x05, 0x00, 0x07, 0x07, 0x18);
    vpatch(rom, 0x12aa0,  16, 0x70, 0x78, 0xFC, 0xFF, 0xFF, 0xFF, 0x7E, 0x00, 0x1F, 0x6F, 0xF6, 0xFB, 0xF0, 0xFE, 0xFF, 0xC3);
    vpatch(rom, 0x12ac0,  16, 0xF0, 0xF6, 0xFF, 0xF3, 0xF3, 0xF9, 0xFF, 0xFF, 0x40, 0x56, 0x5F, 0x5F, 0x0F, 0xF7, 0xF1, 0x09);
    vpatch(rom, 0x12ae0,  16, 0x70, 0x78, 0xFE, 0xFE, 0xFE, 0x7F, 0x7F, 0x00, 0x1F, 0x6F, 0xF6, 0xFB, 0xF1, 0x7E, 0x7F, 0x3E);
    vpatch(rom, 0x12b50,  16, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xC6, 0x6C, 0x44, 0x28, 0xAA, 0xAA, 0xAA, 0x00, 0xFE, 0xFE, 0xFE);
    vpatch(rom, 0x12b80,  32, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xC6, 0x6C, 0x45, 0x28, 0xAA, 0xAA, 0xAA, 0x00, 0xFE, 0xFE, 0xFF, 0x3F, 0x7F, 0x7F, 0x3F, 0x3F, 0x76, 0x63, 0x62, 0x00, 0x2A, 0x0A, 0x2A, 0x00, 0x7F, 0x7F, 0x7F);
    vpatch(rom, 0x12bd0,  16, 0x3F, 0x7F, 0x7F, 0x3F, 0x3F, 0x76, 0x63, 0x62, 0x00, 0x2A, 0x0A, 0x2A, 0x00, 0x7F, 0x7F, 0x7F);
}